

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O3

void __thiscall
HostVector_iterators_and_ranges_Test::TestBody(HostVector_iterators_and_ranges_Test *this)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  void *__ptr;
  char *pcVar10;
  void *ptr;
  Message local_38;
  AssertHelper local_30;
  float local_24;
  internal local_20;
  undefined7 uStack_1f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  iVar8 = posix_memalign((void **)&local_20,8,400);
  lVar9 = 0;
  __ptr = (void *)0x0;
  if (iVar8 == 0) {
    __ptr = (void *)CONCAT71(uStack_1f,local_20);
  }
  do {
    puVar1 = (undefined8 *)((long)__ptr + lVar9 * 4);
    *puVar1 = 0x4040000040400000;
    puVar1[1] = 0x4040000040400000;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 100);
  lVar9 = 0;
  do {
    puVar1 = (undefined8 *)((long)__ptr + lVar9 * 4);
    *puVar1 = 0x4040000040400000;
    puVar1[1] = 0x4040000040400000;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 100);
  local_24 = 0.0;
  lVar9 = 0;
  do {
    local_24 = local_24 + *(float *)((long)__ptr + lVar9);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 400);
  local_38.ss_.ptr_._0_4_ = 0x43960000;
  testing::internal::CmpHelperEQ<float,float>
            (&local_20,"float(3*100)","sum",(float *)&local_38,&local_24);
  if (local_20 == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x8e,pcVar10);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (((CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) &&
        (bVar7 = testing::internal::IsTrue(true), bVar7)) &&
       ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar9 = 0;
  do {
    pfVar2 = (float *)((long)__ptr + lVar9 * 4);
    fVar4 = pfVar2[1];
    fVar5 = pfVar2[2];
    fVar6 = pfVar2[3];
    pfVar3 = (float *)((long)__ptr + lVar9 * 4);
    *pfVar3 = *pfVar2 + 1.0;
    pfVar3[1] = fVar4 + 1.0;
    pfVar3[2] = fVar5 + 1.0;
    pfVar3[3] = fVar6 + 1.0;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 100);
  local_24 = 0.0;
  lVar9 = 0;
  do {
    local_24 = local_24 + *(float *)((long)__ptr + lVar9);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 400);
  local_38.ss_.ptr_._0_4_ = 0x43c80000;
  testing::internal::CmpHelperEQ<float,float>
            (&local_20,"float(4*100)","sum",(float *)&local_38,&local_24);
  if (local_20 == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x97,pcVar10);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (((CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) &&
        (bVar7 = testing::internal::IsTrue(true), bVar7)) &&
       ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  free(__ptr);
  return;
}

Assistant:

TEST(HostVector, iterators_and_ranges) {
    using namespace memory;

    // length constructor
    HostVector<float> v1(100);

    // check that begin()/end() iterators work
    for(auto it=v1.begin(); it<v1.end(); ++it)
        *it = float(3.0);

    // check that range based for loop works
    for(auto &val : v1)
        val = float(3.0);
    {
        float sum = 0;
        // check it works for const
        for(auto val : v1)
            sum+=val;
        EXPECT_EQ(float(3*100), sum);
    }

    // check that std::for_each works
    std::for_each(v1.begin(), v1.end(), [] (float& val) {val+=1;}); // add 1 to every value in v1
    {
        float sum = 0;
        for(auto val : v1)
            sum+=val;
        EXPECT_EQ(float(4*100), sum);
    }
}